

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilCanon.c
# Opt level: O0

void Map_Var4Test(void)

{
  uint local_3c;
  int Count;
  uint uTruth;
  char *pfRes;
  uint *ptRes;
  int i;
  char *pCounters;
  char **uPhases;
  unsigned_short *uCanons;
  
  Extra_Truth4VarN((unsigned_short **)&uPhases,(char ***)&pCounters,
                   (char **)&stack0xffffffffffffffe0,0x10);
  for (ptRes._4_4_ = 0; (int)ptRes._4_4_ < 0x10000; ptRes._4_4_ = ptRes._4_4_ + 1) {
    local_3c = ptRes._4_4_;
    Extra_TruthCanonFastN(5,4,&local_3c,(uint **)&pfRes,(char **)&Count);
  }
  return;
}

Assistant:

void Map_Var4Test()
{
    extern void Extra_Truth4VarN( unsigned short ** puCanons, char *** puPhases, char ** ppCounters, int PhaseMax );

    unsigned short * uCanons;
    char ** uPhases;
    char * pCounters;
    int i;
    unsigned * ptRes;
    char * pfRes;
    unsigned uTruth;
    int Count;

    Extra_Truth4VarN( &uCanons, &uPhases, &pCounters, 16 );

    for ( i = 0; i < 256*256; i++ )
    {
        uTruth = i;
        Count =  Extra_TruthCanonFastN( 5, 4, &uTruth, &ptRes, &pfRes );
    }
}